

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_new.hpp
# Opt level: O0

SparseAccessor * __thiscall
Disa::Matrix_Sparse_Row<double,_int>::SparseAccessor::operator=
          (SparseAccessor *this,const_reference_value value)

{
  csr_data *matrix;
  double *in_R9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  int *local_78;
  Matrix_Sparse_Row<double,_int> local_70;
  pair<std::tuple<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
  local_40;
  undefined1 local_1c [8];
  index_type i_row;
  const_reference_value value_local;
  SparseAccessor *this_local;
  
  unique0x100000e6 = value;
  value_local = (const_reference_value)this;
  local_1c._0_4_ = row(this->row_);
  insert_or_assign<double,int,int>
            (&local_40,(Disa *)this->row_->ptr_data,(CSR_Data<double,_int> *)local_1c,
             &this->i_column,(int *)stack0xffffffffffffffe8,in_R9);
  matrix = this->row_->ptr_data;
  local_80._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&this->row_->ptr_data->row_offset);
  local_78 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(&local_80,(long)(int)local_1c._0_4_);
  Matrix_Sparse_Row(&local_70,matrix,(index_iterator)local_78);
  Matrix_Sparse_Row<double,_int>::operator=(this->row_,&local_70);
  return this;
}

Assistant:

SparseAccessor& operator=(const_reference_value value) {
      const index_type i_row = row_.row();
      insert_or_assign(*row_.ptr_data, i_row, i_column, value);
      row_ = std::move(Matrix_Sparse_Row(row_.ptr_data, row_.ptr_data->row_offset.begin() + i_row));
      return *this;
    }